

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullWriter.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::NullWriter::NullWriter
          (NullWriter *this,IO *io,string *name,Mode mode,Comm *comm)

{
  NullWriterImpl *pNVar1;
  Comm CStack_58;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NullWriter","");
  helper::Comm::Comm(&CStack_58,comm);
  Engine::Engine(&this->super_Engine,&local_50,io,name,mode,&CStack_58);
  helper::Comm::~Comm(&CStack_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__NullWriter_008702d0;
  pNVar1 = (NullWriterImpl *)operator_new(0x10);
  pNVar1->CurrentStep = 0;
  pNVar1->IsInStep = false;
  pNVar1->IsOpen = true;
  (this->Impl)._M_t.
  super___uniq_ptr_impl<adios2::core::engine::NullWriter::NullWriterImpl,_std::default_delete<adios2::core::engine::NullWriter::NullWriterImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_adios2::core::engine::NullWriter::NullWriterImpl_*,_std::default_delete<adios2::core::engine::NullWriter::NullWriterImpl>_>
  .super__Head_base<0UL,_adios2::core::engine::NullWriter::NullWriterImpl_*,_false>._M_head_impl =
       pNVar1;
  (this->super_Engine).m_IsOpen = true;
  return;
}

Assistant:

NullWriter::NullWriter(IO &io, const std::string &name, const Mode mode, helper::Comm comm)
: Engine("NullWriter", io, name, mode, std::move(comm)), Impl(new NullWriter::NullWriterImpl)
{
    m_IsOpen = true;
}